

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 ExtractToken(char **pzIn,char *zEnd,char *zMask,int nMasklen,SyString *pOut)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  char *zPtr;
  char *zIn;
  SyString *pOut_local;
  int nMasklen_local;
  char *zMask_local;
  char *zEnd_local;
  char **pzIn_local;
  
  zPtr = *pzIn;
  while( true ) {
    pcVar1 = zPtr;
    bVar3 = false;
    if ((zPtr < zEnd) && (bVar3 = false, (byte)*zPtr < 0xc0)) {
      iVar2 = CheckMask((int)*zPtr,zMask,nMasklen,(int *)0x0);
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    zPtr = zPtr + 1;
  }
  if (zPtr < zEnd) {
    while (zPtr < zEnd) {
      if ((byte)*zPtr < 0xc0) {
        iVar2 = CheckMask((int)*zPtr,zMask,nMasklen,(int *)0x0);
        if (iVar2 != 0) break;
        zPtr = zPtr + 1;
      }
      else {
        do {
          zPtr = zPtr + 1;
          bVar3 = false;
          if (zPtr < zEnd) {
            bVar3 = (*zPtr & 0xc0U) == 0x80;
          }
        } while (bVar3);
      }
    }
    pOut->zString = pcVar1;
    pOut->nByte = (int)zPtr - (int)pcVar1;
    *pzIn = zPtr;
    pzIn_local._4_4_ = 0;
  }
  else {
    pzIn_local._4_4_ = -0x12;
  }
  return pzIn_local._4_4_;
}

Assistant:

static sxi32 ExtractToken(const char **pzIn, const char *zEnd, const char *zMask, int nMasklen, SyString *pOut)
{
	const char *zIn = *pzIn;
	const char *zPtr;
	/* Ignore leading delimiter */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && CheckMask(zIn[0], zMask, nMasklen, 0) ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* End of input */
		return SXERR_EOF;
	}
	zPtr = zIn;
	/* Extract the token */
	while( zIn < zEnd ){
		if( (unsigned char)zIn[0] >= 0xc0 ){
			/* UTF-8 stream */
			zIn++;
			SX_JMP_UTF8(zIn, zEnd);
		}else{
			if( CheckMask(zIn[0], zMask, nMasklen, 0) ){
				break;
			}
			zIn++;
		}
	}
	SyStringInitFromBuf(pOut, zPtr, zIn-zPtr);
	/* Update the cursor */
	*pzIn = zIn;
	/* Return to the caller */
	return SXRET_OK;
}